

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBidec.c
# Opt level: O2

Gia_Man_t * Gia_ManPerformBidec(Gia_Man_t *p,int fVerbose)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Gia_Man_t *p_03;
  Bdc_Man_t *p_04;
  Gia_Obj_t *pRoot;
  Gia_Obj_t *pGVar4;
  ulong uVar5;
  ulong uVar6;
  Gia_Man_t *p_05;
  uint uVar7;
  ulong uVar8;
  char *pcVar9;
  int iVar10;
  Bdc_Par_t local_44;
  Gia_Man_t *local_38;
  
  local_44.fVeryVerbose = 0;
  local_44.nVarsMax = Gia_ManLutSizeMax(p);
  local_44.fVerbose = fVerbose;
  if (local_44.nVarsMax < 2) {
    pcVar9 = "Resynthesis is not performed when nodes have less than 2 inputs.";
  }
  else {
    if ((uint)local_44.nVarsMax < 0x10) {
      p_00 = Vec_IntAlloc(0);
      p_01 = Vec_IntAlloc(0x10000);
      p_02 = Vec_IntAlloc(0);
      Gia_ManCleanTruth(p);
      Gia_ManFillValue(p);
      p->pObjs->Value = 0;
      p_03 = Gia_ManStart(p->nObjs);
      pcVar9 = Abc_UtilStrsav(p->pName);
      p_03->pName = pcVar9;
      pcVar9 = Abc_UtilStrsav(p->pSpec);
      p_03->pSpec = pcVar9;
      Gia_ManHashAlloc(p_03);
      p_04 = Bdc_ManAlloc(&local_44);
      iVar10 = 1;
      local_38 = p;
      do {
        if ((p->nObjs <= iVar10) || (pRoot = Gia_ManObj(p,iVar10), pRoot == (Gia_Obj_t *)0x0)) {
          Bdc_ManFree(p_04);
          Gia_ManHashStop(p_03);
          iVar10 = Gia_ManHasDangling(p_03);
          p_05 = p_03;
          if (iVar10 != 0) {
            p_05 = Gia_ManCleanup(p_03);
            uVar3 = Gia_ManAndNum(p_05);
            uVar7 = Gia_ManAndNum(p_03);
            if (uVar3 != uVar7) {
              printf("Gia_ManPerformBidec() node count before and after: %6d and %6d.\n",
                     (ulong)uVar3,(ulong)uVar7);
            }
            Gia_ManStop(p_03);
          }
          Gia_ManSetRegNum(p_05,p->nRegs);
          Vec_IntFree(p_00);
          Vec_IntFree(p_01);
          Vec_IntFree(p_02);
          return p_05;
        }
        uVar3 = (uint)*(ulong *)pRoot;
        if ((uVar3 & 0x9fffffff) == 0x9fffffff) {
          pGVar4 = Gia_ManAppendObj(p_03);
          uVar5 = *(ulong *)pGVar4;
          *(ulong *)pGVar4 = uVar5 | 0x9fffffff;
          *(ulong *)pGVar4 =
               uVar5 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p_03->vCis->nSize & 0x1fffffff) << 0x20;
          pVVar1 = p_03->vCis;
          iVar2 = Gia_ObjId(p_03,pGVar4);
          Vec_IntPush(pVVar1,iVar2);
          iVar2 = Gia_ObjId(p_03,pGVar4);
          uVar3 = iVar2 * 2;
LAB_005ad8be:
          pRoot->Value = uVar3;
        }
        else {
          uVar5 = *(ulong *)pRoot & 0x1fffffff;
          if (uVar5 != 0x1fffffff && (int)uVar3 < 0) {
            uVar3 = Abc_LitNotCond(pRoot[-uVar5].Value,uVar3 >> 0x1d & 1);
            uVar7 = uVar3 >> 1;
            if (p_03->nObjs <= (int)uVar7) {
              __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x314,"int Gia_ManAppendCo(Gia_Man_t *, int)");
            }
            pGVar4 = Gia_ManObj(p_03,uVar7);
            if ((~*(uint *)pGVar4 & 0x1fffffff) != 0 && (int)*(uint *)pGVar4 < 0) {
              __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
            }
            pGVar4 = Gia_ManAppendObj(p_03);
            *(ulong *)pGVar4 = *(ulong *)pGVar4 | 0x80000000;
            iVar2 = Gia_ObjId(p_03,pGVar4);
            uVar6 = (ulong)(iVar2 - uVar7 & 0x1fffffff);
            uVar5 = *(ulong *)pGVar4;
            uVar8 = (ulong)((uVar3 & 1) << 0x1d);
            *(ulong *)pGVar4 = uVar8 | uVar5 & 0xffffffffc0000000 | uVar6;
            *(ulong *)pGVar4 =
                 uVar8 | uVar5 & 0xe0000000c0000000 | uVar6 |
                 (ulong)(p_03->vCos->nSize & 0x1fffffff) << 0x20;
            pVVar1 = p_03->vCos;
            iVar2 = Gia_ObjId(p_03,pGVar4);
            Vec_IntPush(pVVar1,iVar2);
            if (p_03->pFanData != (int *)0x0) {
              Gia_ObjAddFanout(p_03,pGVar4 + -(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff),
                               pGVar4);
            }
            iVar2 = Gia_ObjId(p_03,pGVar4);
            uVar3 = iVar2 * 2;
            p = local_38;
            goto LAB_005ad8be;
          }
          iVar2 = Vec_IntEntry(p->vMapping,iVar10);
          if (iVar2 != 0) {
            uVar3 = Gia_ObjPerformBidec(p_04,p_03,p,pRoot,p_00,p_01,p_02);
            goto LAB_005ad8be;
          }
        }
        iVar10 = iVar10 + 1;
      } while( true );
    }
    pcVar9 = "Resynthesis is not performed when nodes have more than 15 inputs.";
  }
  puts(pcVar9);
  return (Gia_Man_t *)0x0;
}

Assistant:

Gia_Man_t * Gia_ManPerformBidec( Gia_Man_t * p, int fVerbose )
{
    Bdc_Man_t * pManDec;
    Bdc_Par_t Pars = {0}, * pPars = &Pars;
    Vec_Int_t * vLeaves, * vTruth, * vVisited;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i;//, clk = Abc_Clock();
    pPars->nVarsMax = Gia_ManLutSizeMax( p );
    pPars->fVerbose = fVerbose;
    if ( pPars->nVarsMax < 2 )
    {
        printf( "Resynthesis is not performed when nodes have less than 2 inputs.\n" );
        return NULL;
    }
    if ( pPars->nVarsMax > 15 )
    {
        printf( "Resynthesis is not performed when nodes have more than 15 inputs.\n" );
        return NULL;
    }
    vLeaves  = Vec_IntAlloc( 0 );
    vTruth   = Vec_IntAlloc( (1<<16) );
    vVisited = Vec_IntAlloc( 0 );
    // clean the old manager
    Gia_ManCleanTruth( p );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    // start the new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
//    Gia_ManCleanLevels( pNew, Gia_ManObjNum(p) );
    pManDec = Bdc_ManAlloc( pPars );
    Gia_ManForEachObj1( p, pObj, i )
    {        
        if ( Gia_ObjIsCi(pObj) ) // transfer the CI level (is it needed?)
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsLut(p, i) )
            pObj->Value = Gia_ObjPerformBidec( pManDec, pNew, p, pObj, vLeaves, vTruth, vVisited );
    }
    Bdc_ManFree( pManDec );
    // cleanup the AIG
    Gia_ManHashStop( pNew );
    // check the presence of dangling nodes
    if ( Gia_ManHasDangling(pNew) )
    {
        pNew = Gia_ManCleanup( pTemp = pNew );
        if ( Gia_ManAndNum(pNew) != Gia_ManAndNum(pTemp) )
            printf( "Gia_ManPerformBidec() node count before and after: %6d and %6d.\n", Gia_ManAndNum(pNew), Gia_ManAndNum(pTemp) );
        Gia_ManStop( pTemp );
    }
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    Vec_IntFree( vLeaves );
    Vec_IntFree( vTruth );
    Vec_IntFree( vVisited );
    if ( fVerbose )
    {
//        printf( "Total gain in AIG nodes = %d.  ", Gia_ManObjNum(p)-Gia_ManObjNum(pNew) );
//        ABC_PRT( "Total runtime", Abc_Clock() - clk );
    }
    return pNew;
}